

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_reflecttitle(_glist *x)

{
  t_atom *ptVar1;
  _canvasenvironment *p_Var2;
  size_t sVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  char namebuf [1000];
  undefined2 local_418;
  undefined1 local_416;
  undefined1 local_31;
  
  p_Var2 = canvas_getenv(x);
  uVar4 = *(ushort *)&x->field_0xe8;
  if ((uVar4 & 1) == 0) {
    bug("canvas_reflecttitle");
    return;
  }
  if (p_Var2->ce_argc == 0) {
    local_418 = (ushort)local_418._1_1_ << 8;
  }
  else {
    local_416 = 0;
    local_418 = 0x2820;
    if (0 < p_Var2->ce_argc) {
      lVar6 = 0;
      lVar5 = 0;
      do {
        sVar3 = strlen((char *)&local_418);
        if (0x1ef < sVar3) break;
        if (lVar5 != 0) {
          sVar3 = strlen((char *)&local_418);
          *(undefined2 *)((long)&local_418 + sVar3) = 0x20;
        }
        ptVar1 = p_Var2->ce_argv;
        sVar3 = strlen((char *)&local_418);
        atom_string((t_atom *)((long)&ptVar1->a_type + lVar6),(char *)((long)&local_418 + sVar3),500
                   );
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 < p_Var2->ce_argc);
      uVar4 = *(ushort *)&x->field_0xe8;
    }
    sVar3 = strlen((char *)&local_418);
    *(undefined2 *)((long)&local_418 + sVar3) = 0x29;
  }
  if ((uVar4 & 0x20) != 0) {
    sVar3 = strlen((char *)&local_418);
    strncat((char *)&local_418," [edit]",999 - sVar3);
    local_31 = 0;
  }
  p_Var2 = canvas_getenv(x);
  pdgui_vmess("pdtk_canvas_reflecttitle","^ sss i",x,p_Var2->ce_dir->s_name,x->gl_name->s_name,
              &local_418,*(uint *)&x->field_0xe8 >> 2 & 1);
  return;
}

Assistant:

void canvas_reflecttitle(t_canvas *x)
{
    char namebuf[MAXPDSTRING];
    t_canvasenvironment *env = canvas_getenv(x);
    if (!x->gl_havewindow)
    {
        bug("canvas_reflecttitle");
        return;
    }
    if (env->ce_argc)
    {
        int i;
        strcpy(namebuf, " (");
        for (i = 0; i < env->ce_argc; i++)
        {
            if (strlen(namebuf) > MAXPDSTRING/2 - 5)
                break;
            if (i != 0)
                strcat(namebuf, " ");
            atom_string(&env->ce_argv[i], namebuf + strlen(namebuf),
                MAXPDSTRING/2);
        }
        strcat(namebuf, ")");
    }
    else namebuf[0] = 0;
    if (x->gl_edit)
    {
        strncat(namebuf, " [edit]", MAXPDSTRING-strlen(namebuf)-1);
        namebuf[MAXPDSTRING-1] = 0;
    }
    pdgui_vmess("pdtk_canvas_reflecttitle", "^ sss i",
        x,
        canvas_getdir(x)->s_name, x->gl_name->s_name, namebuf,
        x->gl_dirty);
}